

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

void gb_corrupt_wave_ram(gb_sound_t *gb)

{
  byte bVar1;
  long lVar2;
  
  if ((gb->gbMode == '\0') && (gb->NoWaveCorrupt == '\0')) {
    bVar1 = (gb->snd_3).offset;
    if (bVar1 < 8) {
      gb->snd_regs[0x20] = gb->snd_regs[(ulong)(bVar1 >> 1) + 0x20];
      return;
    }
    lVar2 = 0;
    do {
      gb->snd_regs[lVar2 + 0x20] = gb->snd_regs[lVar2 + (ulong)(bVar1 >> 3) * 4 + 0x20];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  return;
}

Assistant:

static void gb_corrupt_wave_ram(gb_sound_t *gb)
{
	if (gb->gbMode != GBMODE_DMG || gb->NoWaveCorrupt)
		return;

	if (gb->snd_3.offset < 8)
	{
		gb->snd_regs[AUD3W0] = gb->snd_regs[AUD3W0 + (gb->snd_3.offset/2)];
	}
	else
	{
		int i;
		for (i = 0; i < 4; i++)
		{
			gb->snd_regs[AUD3W0 + i] = gb->snd_regs[AUD3W0 + ((gb->snd_3.offset / 2) & ~0x03) + i];
		}
	}
}